

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lru_cache.hpp
# Opt level: O3

void __thiscall
cappuccino::lru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1>::do_insert
          (lru_cache<unsigned_long,_unsigned_long,_(cappuccino::thread_safe)1> *this,
          unsigned_long *key,unsigned_long *value)

{
  long lVar1;
  __off64_t *in_R8;
  size_t in_R9;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_false>,_bool>
  pVar2;
  unsigned_long element_idx;
  long lVar3;
  
  if ((*(ulong *)(this + 0x28) != 0) &&
     ((ulong)((*(long *)(this + 0x38) - *(long *)(this + 0x30) >> 3) * -0x5555555555555555) <=
      *(ulong *)(this + 0x28))) {
    do_erase(this,*(size_t *)(*(long *)(this + 0x88) + 0x10));
  }
  lVar3 = *(long *)(*(long *)(this + 0x98) + 0x10);
  pVar2 = std::
          _Hashtable<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<unsigned_long_const&,unsigned_long&>
                    ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)(this + 0x48),key,&stack0xffffffffffffffd8);
  lVar1 = *(long *)(this + 0x30);
  *(unsigned_long *)(lVar1 + 0x10 + lVar3 * 0x18) = *value;
  *(undefined8 *)(lVar1 + 8 + lVar3 * 0x18) = *(undefined8 *)(this + 0x98);
  ((_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false> *)
  (lVar1 + lVar3 * 0x18))->_M_cur =
       (__node_type *)
       pVar2.first.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
       _M_cur;
  *(undefined8 *)(this + 0x98) = **(undefined8 **)(this + 0x98);
  *(long *)(this + 0x28) = *(long *)(this + 0x28) + 1;
  std::__cxx11::list<unsigned_long,_std::allocator<unsigned_long>_>::splice
            ((list<unsigned_long,_std::allocator<unsigned_long>_> *)(this + 0x80),
             (int)*(undefined8 *)(this + 0x80),(__off64_t *)(this + 0x80),
             (int)*(undefined8 *)(lVar1 + 8 + lVar3 * 0x18),in_R8,in_R9,(uint)lVar3);
  return;
}

Assistant:

auto do_insert(const key_type& key, value_type&& value) -> void
    {
        if (m_used_size >= m_elements.size())
        {
            do_prune();
        }

        auto element_idx = *m_lru_end;

        auto keyed_position = m_keyed_elements.emplace(key, element_idx).first;

        element& e         = m_elements[element_idx];
        e.m_value          = std::move(value);
        e.m_lru_position   = m_lru_end;
        e.m_keyed_position = keyed_position;

        ++m_lru_end;

        ++m_used_size;

        // This is the most recently used item, put it in the appropriate place.
        do_access(e);
    }